

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O1

Error __thiscall miniros::MasterLink::initLink(MasterLink *this,M_string *remappings)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Internal *pIVar2;
  bool bVar3;
  const_iterator cVar4;
  char *__s;
  char *pcVar5;
  Error_t EVar6;
  key_type local_50;
  
  if (this->internal_ == (Internal *)0x0) {
    EVar6 = InternalError;
  }
  else {
    paVar1 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"__master","");
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&remappings->_M_t,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)cVar4._M_node != &(remappings->_M_t)._M_impl.super__Rb_tree_header) {
      std::__cxx11::string::_M_assign((string *)&this->internal_->uri);
    }
    pIVar2 = this->internal_;
    if ((pIVar2->uri)._M_string_length == 0) {
      __s = getenv("ROS_MASTER_URI");
      if (__s == (char *)0x0) {
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (initLink::loc.initialized_ == false) {
          local_50._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"miniros.master_link","");
          console::initializeLogLocation(&initLink::loc,&local_50,Warn);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != paVar1) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        if (initLink::loc.level_ != Warn) {
          initLink();
        }
        if (initLink::loc.logger_enabled_ == true) {
          initLink();
        }
        pIVar2 = this->internal_;
        pcVar5 = (char *)(pIVar2->uri)._M_string_length;
        __s = "http://localhost:11311";
      }
      else {
        strlen(__s);
        pcVar5 = (char *)0x0;
      }
      std::__cxx11::string::_M_replace((ulong)&pIVar2->uri,0,pcVar5,(ulong)__s);
    }
    pIVar2 = this->internal_;
    bVar3 = network::splitURI(&pIVar2->uri,&pIVar2->host,&pIVar2->port);
    EVar6 = Ok;
    if (!bVar3) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (initLink(std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
          ::loc.initialized_ == false) {
        local_50._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"miniros.master_link","");
        console::initializeLogLocation
                  (&initLink(std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
                    ::loc,&local_50,Fatal);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar1) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      if (initLink(std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
          ::loc.level_ != Fatal) {
        initLink();
      }
      EVar6 = InvalidURI;
      if (initLink(std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
          ::loc.logger_enabled_ == true) {
        initLink(this);
      }
    }
  }
  return (Error)EVar6;
}

Assistant:

Error MasterLink::initLink(const M_string& remappings)
{
  if (!internal_)
    return Error::InternalError;

  auto it = remappings.find("__master");
  if (it != remappings.end()) {
    internal_->uri = it->second;
  }

  if (internal_->uri.empty()) {
    char* master_uri_env = NULL;
#ifdef _MSC_VER
    _dupenv_s(&master_uri_env, NULL, "ROS_MASTER_URI");
#else
    master_uri_env = getenv("ROS_MASTER_URI");
#endif
    if (master_uri_env) {
      internal_->uri = master_uri_env;
    } else {
      MINIROS_WARN("Defaulting ROS_MASTER_URI to localhost:11311");
      internal_->uri = "http://localhost:11311";
    }
#ifdef _MSC_VER
    // http://msdn.microsoft.com/en-us/library/ms175774(v=vs.80).aspx
    free(master_uri_env);
#endif
  }

  // Split URI into
  if (!network::splitURI(internal_->uri, internal_->host, internal_->port)) {
    MINIROS_FATAL("Couldn't parse the master URI [%s] into a host:port pair.", internal_->uri.c_str());
    return Error::InvalidURI;
  }

  return Error::Ok;
}